

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O0

int os_system_linux_netlink_drop_mc(os_system_netlink *nl,int *groups,size_t groupcount)

{
  int iVar1;
  ulong local_48;
  size_t i;
  size_t groupcount_local;
  int *groups_local;
  os_system_netlink *nl_local;
  
  local_48 = 0;
  while( true ) {
    if (groupcount <= local_48) {
      return 0;
    }
    iVar1 = setsockopt((nl->socket).fd.fd,0x10e,2,groups + local_48,4);
    if (iVar1 != 0) break;
    local_48 = local_48 + 1;
  }
  if (((&log_global_mask)[nl->used_by->logging] & 4) != 0) {
    oonf_log(4,nl->used_by->logging,"src/base/os_linux/os_system_linux.c",0x1a7,0,0,
             "Could not drop netlink \'%s\' mc group: %x",nl->name,groups[local_48]);
  }
  return -1;
}

Assistant:

int
os_system_linux_netlink_drop_mc(struct os_system_netlink *nl, const int *groups, size_t groupcount) {
  size_t i;

  for (i = 0; i < groupcount; i++) {
    if (setsockopt(os_fd_get_fd(&nl->socket.fd), SOL_NETLINK, NETLINK_DROP_MEMBERSHIP, &groups[i], sizeof(groups[i]))) {
      OONF_WARN(nl->used_by->logging, "Could not drop netlink '%s' mc group: %x", nl->name, groups[i]);
      return -1;
    }
  }
  return 0;
}